

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_image_atomic
               (NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  ostream *poVar1;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream source;
  int local_48;
  int ndx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar1 = std::operator<<((ostream *)local_1c0,
                             "#version 310 es\nlayout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\nprecision mediump float;\nvoid main()\n{\n\t"
                            );
    poVar1 = std::operator<<(poVar1,shader_image_atomic::s_tests[local_48]);
    std::operator<<(poVar1,"\n}\n");
    ctx_00 = local_10;
    std::__cxx11::ostringstream::str();
    verifyShader(ctx_00,SHADERTYPE_FRAGMENT,&local_1e0,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void shader_image_atomic (NegativeTestContext& ctx)
{
	static const char* const s_tests[] =
	{
		"imageAtomicAdd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMin(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMax(u_image, ivec2(1, 1), 1u);",
		"imageAtomicAnd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicOr(u_image, ivec2(1, 1), 1u);",
		"imageAtomicXor(u_image, ivec2(1, 1), 1u);",
		"imageAtomicExchange(u_image, ivec2(1, 1), 1u);",
		"imageAtomicCompSwap(u_image, ivec2(1, 1), 1u, 1u);",
	};

	ctx.beginSection("GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_tests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_tests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}